

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType::IfcBuildingElementProxyType
          (IfcBuildingElementProxyType *this)

{
  IfcBuildingElementProxyType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcBuildingElementProxyType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__01107060);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>,
             &PTR_construction_vtable_24__01107198);
  *(undefined8 *)this = 0x1106f30;
  *(undefined8 *)&this->field_0x1c0 = 0x1107048;
  *(undefined8 *)&this->field_0x88 = 0x1106f58;
  *(undefined8 *)&this->field_0x98 = 0x1106f80;
  *(undefined8 *)&this->field_0xf0 = 0x1106fa8;
  *(undefined8 *)&this->field_0x148 = 0x1106fd0;
  *(undefined8 *)&this->field_0x180 = 0x1106ff8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x1107020;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcBuildingElementProxyType() : Object("IfcBuildingElementProxyType") {}